

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c++
# Opt level: O1

void * kj::_::HeapArrayDisposer::allocateImpl
                 (size_t elementSize,size_t elementCount,size_t capacity,
                 _func_void_void_ptr *constructElement,_func_void_void_ptr *destroyElement)

{
  void *pvVar1;
  size_t sVar2;
  void *pvVar3;
  
  pvVar1 = operator_new(capacity * elementSize);
  if (constructElement != (_func_void_void_ptr *)0x0) {
    if (destroyElement == (_func_void_void_ptr *)0x0) {
      pvVar3 = pvVar1;
      if (elementCount != 0) {
        do {
          (*constructElement)(pvVar3);
          elementCount = elementCount - 1;
          pvVar3 = (void *)((long)pvVar3 + elementSize);
        } while (elementCount != 0);
      }
    }
    else if (elementCount != 0) {
      sVar2 = 0;
      pvVar3 = pvVar1;
      do {
        (*constructElement)(pvVar3);
        pvVar3 = (void *)((long)pvVar3 + elementSize);
        sVar2 = sVar2 + 1;
      } while (elementCount != sVar2);
    }
  }
  operator_delete((void *)0x0);
  return pvVar1;
}

Assistant:

void* HeapArrayDisposer::allocateImpl(size_t elementSize, size_t elementCount, size_t capacity,
                                      void (*constructElement)(void*),
                                      void (*destroyElement)(void*)) {
  AutoDeleter result(operator new(elementSize * capacity));

  if (constructElement == nullptr) {
    // Nothing to do.
  } else if (destroyElement == nullptr) {
    byte* pos = reinterpret_cast<byte*>(result.ptr);
    while (elementCount > 0) {
      constructElement(pos);
      pos += elementSize;
      --elementCount;
    }
  } else {
    ExceptionSafeArrayUtil guard(result.ptr, elementSize, 0, destroyElement);
    guard.construct(elementCount, constructElement);
    guard.release();
  }

  return result.release();
}